

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int file_read(file_t *file,uchar *buf,size_t size)

{
  int iVar1;
  int res;
  size_t size_local;
  uchar *buf_local;
  file_t *file_local;
  
  if (file == (file_t *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x18,
                  "int file_read(file_t *, unsigned char *, size_t)");
  }
  if (buf != (uchar *)0x0) {
    if (size != 0) {
      iVar1 = unix_read(file->fd,buf,size);
      if (0 < iVar1) {
        file->pos = (long)iVar1 + file->pos;
      }
      return iVar1;
    }
    __assert_fail("size > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",
                  0x1a,"int file_read(file_t *, unsigned char *, size_t)");
  }
  __assert_fail("buf != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c"
                ,0x19,"int file_read(file_t *, unsigned char *, size_t)");
}

Assistant:

int file_read(file_t *file, unsigned char *buf, size_t size) {
  assert(file != NULL);
  assert(buf != NULL);
  assert(size > 0);

  int res = unix_read(file->fd, buf, size);
  if (res > 0) {
    file->pos += res;
  }
  return res;
}